

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void finalize_sym_filter(int wiener_win,int32_t *f,int16_t *fi)

{
  short sVar1;
  int16_t iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  ushort uVar9;
  undefined4 uVar8;
  short sVar7;
  ushort uVar10;
  
  for (uVar5 = 0; (uint)wiener_win >> 1 != uVar5; uVar5 = uVar5 + 1) {
    lVar3 = (long)f[uVar5] * 0x80;
    if ((long)f[uVar5] < 0) {
      iVar2 = (int16_t)((lVar3 + -0x8000) / 0x10000);
    }
    else {
      iVar2 = (int16_t)((ulong)(lVar3 + 0x8000) >> 0x10);
    }
    fi[uVar5] = iVar2;
  }
  if (wiener_win == 7) {
    sVar7 = (short)*(undefined4 *)fi;
    sVar1 = (short)((uint)*(undefined4 *)fi >> 0x10);
    uVar6 = (ushort)(10 < sVar7) * 10 | (ushort)(10 >= sVar7) * sVar7;
    uVar9 = (ushort)(8 < sVar1) * 8 | (ushort)(8 >= sVar1) * sVar1;
    uVar10 = (ushort)((short)uVar9 < -0x17) * -0x17 | ((short)uVar9 >= -0x17) * uVar9;
    uVar8 = CONCAT22(uVar10,(ushort)((short)uVar6 < -5) * -5 | ((short)uVar6 >= -5) * uVar6);
    *(undefined4 *)fi = uVar8;
    uVar9 = 0x2e;
    if (fi[2] < 0x2e) {
      uVar9 = fi[2];
    }
    uVar6 = 0xffef;
    if (-0x11 < (short)uVar9) {
      uVar6 = uVar9;
    }
    fi[2] = uVar6;
    uVar4 = (uint)uVar10;
  }
  else {
    sVar7 = (short)*(undefined4 *)fi;
    sVar1 = (short)((uint)*(undefined4 *)fi >> 0x10);
    uVar9 = (ushort)(8 < sVar7) * 8 | (ushort)(8 >= sVar7) * sVar7;
    uVar6 = (ushort)(0x2e < sVar1) * 0x2e | (ushort)(0x2e >= sVar1) * sVar1;
    uVar6 = (ushort)((short)uVar6 < -0x11) * -0x11 | ((short)uVar6 >= -0x11) * uVar6;
    uVar4 = CONCAT22(uVar6,(ushort)((short)uVar9 < -0x17) * -0x17 | ((short)uVar9 >= -0x17) * uVar9)
    ;
    *(uint *)(fi + 1) = uVar4;
    *fi = 0;
    uVar8 = 0;
  }
  fi[6] = (short)uVar8;
  fi[5] = (short)uVar4;
  fi[4] = uVar6;
  fi[3] = (uVar6 + (short)uVar4 + (short)uVar8) * -2;
  return;
}

Assistant:

static inline void finalize_sym_filter(int wiener_win, int32_t *f,
                                       InterpKernel fi) {
  int i;
  const int wiener_halfwin = (wiener_win >> 1);

  for (i = 0; i < wiener_halfwin; ++i) {
    const int64_t dividend = (int64_t)f[i] * WIENER_FILT_STEP;
    const int64_t divisor = WIENER_TAP_SCALE_FACTOR;
    // Perform this division with proper rounding rather than truncation
    if (dividend < 0) {
      fi[i] = (int16_t)((dividend - (divisor / 2)) / divisor);
    } else {
      fi[i] = (int16_t)((dividend + (divisor / 2)) / divisor);
    }
  }
  // Specialize for 7-tap filter
  if (wiener_win == WIENER_WIN) {
    fi[0] = CLIP(fi[0], WIENER_FILT_TAP0_MINV, WIENER_FILT_TAP0_MAXV);
    fi[1] = CLIP(fi[1], WIENER_FILT_TAP1_MINV, WIENER_FILT_TAP1_MAXV);
    fi[2] = CLIP(fi[2], WIENER_FILT_TAP2_MINV, WIENER_FILT_TAP2_MAXV);
  } else {
    fi[2] = CLIP(fi[1], WIENER_FILT_TAP2_MINV, WIENER_FILT_TAP2_MAXV);
    fi[1] = CLIP(fi[0], WIENER_FILT_TAP1_MINV, WIENER_FILT_TAP1_MAXV);
    fi[0] = 0;
  }
  // Satisfy filter constraints
  fi[WIENER_WIN - 1] = fi[0];
  fi[WIENER_WIN - 2] = fi[1];
  fi[WIENER_WIN - 3] = fi[2];
  // The central element has an implicit +WIENER_FILT_STEP
  fi[3] = -2 * (fi[0] + fi[1] + fi[2]);
}